

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# box.hpp
# Opt level: O0

void __thiscall
pico_tree::internal::box_base<pico_tree::internal::box<double,_2UL>_>::fit
          (box_base<pico_tree::internal::box<double,_2UL>_> *this,scalar_type *x)

{
  double dVar1;
  scalar_type sVar2;
  box<double,_2UL> *this_00;
  size_type sVar3;
  scalar_type *psVar4;
  long in_RSI;
  box_base<pico_tree::internal::box<double,_2UL>_> *in_RDI;
  size_type i;
  scalar_type in_stack_ffffffffffffffb8;
  box_base<pico_tree::internal::box<double,_2UL>_> *in_stack_ffffffffffffffc0;
  undefined8 local_18;
  
  local_18 = 0;
  while( true ) {
    this_00 = derived(in_RDI);
    sVar3 = box<double,_2UL>::size(this_00);
    if (sVar3 <= local_18) break;
    dVar1 = *(double *)(in_RSI + local_18 * 8);
    psVar4 = min(in_stack_ffffffffffffffc0,(size_type)in_stack_ffffffffffffffb8);
    if (dVar1 < *psVar4) {
      sVar2 = *(scalar_type *)(in_RSI + local_18 * 8);
      psVar4 = min(in_stack_ffffffffffffffc0,(size_type)in_stack_ffffffffffffffb8);
      *psVar4 = sVar2;
    }
    in_stack_ffffffffffffffc0 =
         *(box_base<pico_tree::internal::box<double,_2UL>_> **)(in_RSI + local_18 * 8);
    psVar4 = max(in_stack_ffffffffffffffc0,(size_type)in_stack_ffffffffffffffb8);
    if (*psVar4 <= (double)in_stack_ffffffffffffffc0 && (double)in_stack_ffffffffffffffc0 != *psVar4
       ) {
      in_stack_ffffffffffffffb8 = *(scalar_type *)(in_RSI + local_18 * 8);
      psVar4 = max(in_stack_ffffffffffffffc0,(size_type)in_stack_ffffffffffffffb8);
      *psVar4 = in_stack_ffffffffffffffb8;
    }
    local_18 = local_18 + 1;
  }
  return;
}

Assistant:

constexpr void fit(scalar_type const* x) {
    for (size_type i = 0; i < derived().size(); ++i) {
      if (x[i] < min(i)) {
        min(i) = x[i];
      }
      if (x[i] > max(i)) {
        max(i) = x[i];
      }
    }
  }